

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O0

void __thiscall OpenMD::SimInfo::prepareTopology(SimInfo *this)

{
  int iVar1;
  reference pvVar2;
  SimInfo *in_RDI;
  RealType RVar3;
  RealType RVar4;
  int reg;
  RealType totalMass;
  Atom *atom;
  AtomIterator ai;
  CutoffGroup *cg;
  CutoffGroupIterator ci;
  Molecule *mol;
  MoleculeIterator mi;
  value_type_conflict1 *in_stack_ffffffffffffff68;
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *__x;
  CutoffGroup *in_stack_ffffffffffffff80;
  vector<int,_std::allocator<int>_> *this_01;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff88;
  SimInfo *in_stack_ffffffffffffff90;
  double in_stack_ffffffffffffff98;
  vector<double,_std::allocator<double>_> *this_02;
  Atom *local_38;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_30;
  CutoffGroup *local_28;
  __normal_iterator<OpenMD::CutoffGroup_**,_std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>_>
  local_20;
  Molecule *local_18;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_10 [2];
  
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_10);
  __gnu_cxx::
  __normal_iterator<OpenMD::CutoffGroup_**,_std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>_>
  ::__normal_iterator(&local_20);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_30);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x1535ae);
  this_02 = &in_RDI->massFactors_;
  getNAtoms(in_RDI);
  std::vector<double,_std::allocator<double>_>::resize
            (this_02,(size_type)in_stack_ffffffffffffff98,
             (value_type_conflict2 *)in_stack_ffffffffffffff90);
  local_18 = beginMolecule(in_stack_ffffffffffffff90,(MoleculeIterator *)in_stack_ffffffffffffff88);
  while (local_18 != (Molecule *)0x0) {
    local_28 = Molecule::beginCutoffGroup
                         ((Molecule *)in_stack_ffffffffffffff90,
                          (iterator *)in_stack_ffffffffffffff88);
    while (local_28 != (CutoffGroup *)0x0) {
      RVar3 = CutoffGroup::getMass(in_stack_ffffffffffffff80);
      local_38 = CutoffGroup::beginAtom
                           ((CutoffGroup *)in_stack_ffffffffffffff90,
                            (iterator *)in_stack_ffffffffffffff88);
      while (local_38 != (Atom *)0x0) {
        if ((RVar3 != 0.0) || (NAN(RVar3))) {
          RVar4 = StuntDouble::getMass(&local_38->super_StuntDouble);
          in_stack_ffffffffffffff98 = RVar4 / RVar3;
          in_stack_ffffffffffffff90 = (SimInfo *)&in_RDI->massFactors_;
          iVar1 = StuntDouble::getLocalIndex(&local_38->super_StuntDouble);
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff90,
                              (long)iVar1);
          *pvVar2 = in_stack_ffffffffffffff98;
        }
        else {
          in_stack_ffffffffffffff88 = &in_RDI->massFactors_;
          iVar1 = StuntDouble::getLocalIndex(&local_38->super_StuntDouble);
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             (in_stack_ffffffffffffff88,(long)iVar1);
          *pvVar2 = 1.0;
        }
        local_38 = CutoffGroup::nextAtom
                             ((CutoffGroup *)in_stack_ffffffffffffff90,
                              (iterator *)in_stack_ffffffffffffff88);
      }
      local_28 = Molecule::nextCutoffGroup
                           ((Molecule *)in_stack_ffffffffffffff90,
                            (iterator *)in_stack_ffffffffffffff88);
    }
    local_18 = nextMolecule(in_stack_ffffffffffffff90,(MoleculeIterator *)in_stack_ffffffffffffff88)
    ;
  }
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x15375d);
  __x = &in_RDI->identArray_;
  getNAtoms(in_RDI);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)this_02,(size_type)in_stack_ffffffffffffff98);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x153794);
  this_01 = &in_RDI->regions_;
  getNAtoms(in_RDI);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)this_02,(size_type)in_stack_ffffffffffffff98);
  local_18 = beginMolecule(in_stack_ffffffffffffff90,(MoleculeIterator *)in_stack_ffffffffffffff88);
  while (local_18 != (Molecule *)0x0) {
    Molecule::getRegion((Molecule *)0x1537f0);
    local_38 = Molecule::beginAtom((Molecule *)in_stack_ffffffffffffff90,
                                   (iterator *)in_stack_ffffffffffffff88);
    while (local_38 != (Atom *)0x0) {
      this_00 = &in_RDI->identArray_;
      Atom::getIdent((Atom *)0x15382d);
      std::vector<int,_std::allocator<int>_>::push_back(this_00,in_stack_ffffffffffffff68);
      std::vector<int,_std::allocator<int>_>::push_back(this_01,(value_type_conflict1 *)__x);
      local_38 = Molecule::nextAtom((Molecule *)in_stack_ffffffffffffff90,
                                    (iterator *)in_stack_ffffffffffffff88);
    }
    local_18 = nextMolecule(in_stack_ffffffffffffff90,(MoleculeIterator *)in_stack_ffffffffffffff88)
    ;
  }
  in_RDI->topologyDone_ = true;
  return;
}

Assistant:

void SimInfo::prepareTopology() {
    // calculate mass ratio of cutoff group
    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::CutoffGroupIterator ci;
    CutoffGroup* cg;
    Molecule::AtomIterator ai;
    Atom* atom;
    RealType totalMass;

    /**
     * The mass factor is the relative mass of an atom to the total
     * mass of the cutoff group it belongs to.  By default, all atoms
     * are their own cutoff groups, and therefore have mass factors of
     * 1.  We need some special handling for massless atoms, which
     * will be treated as carrying the entire mass of the cutoff
     * group.
     */
    massFactors_.clear();
    massFactors_.resize(getNAtoms(), 1.0);

    for (mol = beginMolecule(mi); mol != NULL; mol = nextMolecule(mi)) {
      for (cg = mol->beginCutoffGroup(ci); cg != NULL;
           cg = mol->nextCutoffGroup(ci)) {
        totalMass = cg->getMass();
        for (atom = cg->beginAtom(ai); atom != NULL; atom = cg->nextAtom(ai)) {
          // Check for massless groups - set mfact to 1 if true
          if (totalMass != 0)
            massFactors_[atom->getLocalIndex()] = atom->getMass() / totalMass;
          else
            massFactors_[atom->getLocalIndex()] = 1.0;
        }
      }
    }

    // Build the identArray_ and regions_

    identArray_.clear();
    identArray_.reserve(getNAtoms());
    regions_.clear();
    regions_.reserve(getNAtoms());

    for (mol = beginMolecule(mi); mol != NULL; mol = nextMolecule(mi)) {
      int reg = mol->getRegion();
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        identArray_.push_back(atom->getIdent());
        regions_.push_back(reg);
      }
    }

    topologyDone_ = true;
  }